

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcUniformBlockCase.cpp
# Opt level: O0

void deqp::ub::anon_unknown_1::generateCompareSrc
               (ostringstream *src,char *resultVar,VarType *type,char *srcName,char *apiName,
               UniformLayout *layout,void *basePtr,deUint32 unusedMask)

{
  undefined4 uVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  const_reference entry_00;
  ostream *poVar5;
  StructType *pSVar6;
  pointer pSVar7;
  char *pcVar8;
  VarType *pVVar9;
  char *pcVar10;
  DataType local_2cc;
  allocator<char> local_2b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  allocator<char> local_271;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  allocator<char> local_229;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  undefined1 local_208 [8];
  string op_1;
  __normal_iterator<const_deqp::ub::StructMember_*,_std::vector<deqp::ub::StructMember,_std::allocator<deqp::ub::StructMember>_>_>
  local_1e0;
  ConstIterator memberIter;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  allocator<char> local_189;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  string local_148;
  allocator<char> local_121;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  undefined1 local_e0 [8];
  string op;
  int elementNdx;
  VarType *elementType_1;
  int elemNdx;
  UniformLayoutEntry *entry;
  int uniformNdx;
  allocator<char> local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [8];
  string fullApiName;
  char *typeName;
  DataType elementType;
  bool isArray;
  UniformLayout *layout_local;
  char *apiName_local;
  char *srcName_local;
  VarType *type_local;
  char *resultVar_local;
  ostringstream *src_local;
  
  bVar2 = ub::VarType::isBasicType(type);
  if (bVar2) {
LAB_017222c3:
    bVar2 = ub::VarType::isArrayType(type);
    if (bVar2) {
      pVVar9 = ub::VarType::getElementType(type);
      local_2cc = ub::VarType::getBasicType(pVVar9);
    }
    else {
      local_2cc = ub::VarType::getBasicType(type);
    }
    fullApiName.field_2._8_8_ = glu::getDataTypeName(local_2cc);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,apiName,&local_89);
    pcVar8 = "";
    if (bVar2) {
      pcVar8 = "[0]";
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                   &local_88,pcVar8);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator(&local_89);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    iVar3 = UniformLayout::getUniformIndex(layout,pcVar8);
    entry_00 = std::
               vector<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>::
               operator[](&layout->uniforms,(long)iVar3);
    if (bVar2) {
      for (elementType_1._4_4_ = 0; iVar3 = ub::VarType::getArraySize(type),
          elementType_1._4_4_ < iVar3; elementType_1._4_4_ = elementType_1._4_4_ + 1) {
        poVar5 = std::operator<<(&src->super_basic_ostream<char,_std::char_traits<char>_>,
                                 "\tresult *= compare_");
        poVar5 = std::operator<<(poVar5,(char *)fullApiName.field_2._8_8_);
        poVar5 = std::operator<<(poVar5,"(");
        poVar5 = std::operator<<(poVar5,srcName);
        poVar5 = std::operator<<(poVar5,"[");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,elementType_1._4_4_);
        std::operator<<(poVar5,"], ");
        generateValueSrc(src,entry_00,basePtr,elementType_1._4_4_);
        std::operator<<(&src->super_basic_ostream<char,_std::char_traits<char>_>,");\n");
      }
    }
    else {
      poVar5 = std::operator<<(&src->super_basic_ostream<char,_std::char_traits<char>_>,
                               "\tresult *= compare_");
      poVar5 = std::operator<<(poVar5,(char *)fullApiName.field_2._8_8_);
      poVar5 = std::operator<<(poVar5,"(");
      poVar5 = std::operator<<(poVar5,srcName);
      std::operator<<(poVar5,", ");
      generateValueSrc(src,entry_00,basePtr,0);
      std::operator<<(&src->super_basic_ostream<char,_std::char_traits<char>_>,");\n");
    }
    std::__cxx11::string::~string((string *)local_68);
  }
  else {
    bVar2 = ub::VarType::isArrayType(type);
    if (bVar2) {
      pVVar9 = ub::VarType::getElementType(type);
      bVar2 = ub::VarType::isBasicType(pVVar9);
      if (bVar2) goto LAB_017222c3;
    }
    bVar2 = ub::VarType::isArrayType(type);
    if (bVar2) {
      pVVar9 = ub::VarType::getElementType(type);
      for (op.field_2._12_4_ = 0; uVar1 = op.field_2._12_4_, iVar3 = ub::VarType::getArraySize(type)
          , (int)uVar1 < iVar3; op.field_2._12_4_ = op.field_2._12_4_ + 1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"[",&local_121);
        de::toString<int>(&local_148,(int *)(op.field_2._M_local_buf + 0xc));
        std::operator+(&local_100,&local_120,&local_148);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0
                       ,&local_100,"]");
        std::__cxx11::string::~string((string *)&local_100);
        std::__cxx11::string::~string((string *)&local_148);
        std::__cxx11::string::~string((string *)&local_120);
        std::allocator<char>::~allocator(&local_121);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,srcName,&local_189);
        std::operator+(&local_168,&local_188,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0
                      );
        pcVar8 = (char *)std::__cxx11::string::c_str();
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1d0,apiName,
                   (allocator<char> *)((long)&memberIter._M_current + 7));
        std::operator+(&local_1b0,&local_1d0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0
                      );
        pcVar10 = (char *)std::__cxx11::string::c_str();
        generateCompareSrc(src,resultVar,pVVar9,pcVar8,pcVar10,layout,basePtr,unusedMask);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::allocator<char>::~allocator((allocator<char> *)((long)&memberIter._M_current + 7));
        std::__cxx11::string::~string((string *)&local_168);
        std::__cxx11::string::~string((string *)&local_188);
        std::allocator<char>::~allocator(&local_189);
        std::__cxx11::string::~string((string *)local_e0);
      }
    }
    else {
      pSVar6 = ub::VarType::getStruct(type);
      local_1e0._M_current = (StructMember *)StructType::begin(pSVar6);
      while( true ) {
        pSVar6 = ub::VarType::getStruct(type);
        op_1.field_2._8_8_ = StructType::end(pSVar6);
        bVar2 = __gnu_cxx::operator!=
                          (&local_1e0,
                           (__normal_iterator<const_deqp::ub::StructMember_*,_std::vector<deqp::ub::StructMember,_std::allocator<deqp::ub::StructMember>_>_>
                            *)((long)&op_1.field_2 + 8));
        if (!bVar2) break;
        pSVar7 = __gnu_cxx::
                 __normal_iterator<const_deqp::ub::StructMember_*,_std::vector<deqp::ub::StructMember,_std::allocator<deqp::ub::StructMember>_>_>
                 ::operator->(&local_1e0);
        dVar4 = StructMember::getFlags(pSVar7);
        if ((dVar4 & unusedMask) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,".",&local_229);
          pSVar7 = __gnu_cxx::
                   __normal_iterator<const_deqp::ub::StructMember_*,_std::vector<deqp::ub::StructMember,_std::allocator<deqp::ub::StructMember>_>_>
                   ::operator->(&local_1e0);
          pcVar8 = StructMember::getName(pSVar7);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_208,&local_228,pcVar8);
          std::__cxx11::string::~string((string *)&local_228);
          std::allocator<char>::~allocator(&local_229);
          pSVar7 = __gnu_cxx::
                   __normal_iterator<const_deqp::ub::StructMember_*,_std::vector<deqp::ub::StructMember,_std::allocator<deqp::ub::StructMember>_>_>
                   ::operator->(&local_1e0);
          pVVar9 = StructMember::getType(pSVar7);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_270,srcName,&local_271);
          std::operator+(&local_250,&local_270,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_208);
          pcVar8 = (char *)std::__cxx11::string::c_str();
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2b8,apiName,&local_2b9);
          std::operator+(&local_298,&local_2b8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_208);
          pcVar10 = (char *)std::__cxx11::string::c_str();
          generateCompareSrc(src,resultVar,pVVar9,pcVar8,pcVar10,layout,basePtr,unusedMask);
          std::__cxx11::string::~string((string *)&local_298);
          std::__cxx11::string::~string((string *)&local_2b8);
          std::allocator<char>::~allocator(&local_2b9);
          std::__cxx11::string::~string((string *)&local_250);
          std::__cxx11::string::~string((string *)&local_270);
          std::allocator<char>::~allocator(&local_271);
          std::__cxx11::string::~string((string *)local_208);
        }
        __gnu_cxx::
        __normal_iterator<const_deqp::ub::StructMember_*,_std::vector<deqp::ub::StructMember,_std::allocator<deqp::ub::StructMember>_>_>
        ::operator++(&local_1e0,0);
      }
    }
  }
  return;
}

Assistant:

void generateCompareSrc(std::ostringstream& src, const char* resultVar, const VarType& type, const char* srcName,
						const char* apiName, const UniformLayout& layout, const void* basePtr, deUint32 unusedMask)
{
	if (type.isBasicType() || (type.isArrayType() && type.getElementType().isBasicType()))
	{
		// Basic type or array of basic types.
		bool		  isArray	 = type.isArrayType();
		glu::DataType elementType = isArray ? type.getElementType().getBasicType() : type.getBasicType();
		const char*   typeName	= glu::getDataTypeName(elementType);
		std::string   fullApiName = string(apiName) + (isArray ? "[0]" : ""); // Arrays are always postfixed with [0]
		int			  uniformNdx  = layout.getUniformIndex(fullApiName.c_str());
		const UniformLayoutEntry& entry = layout.uniforms[uniformNdx];

		if (isArray)
		{
			for (int elemNdx = 0; elemNdx < type.getArraySize(); elemNdx++)
			{
				src << "\tresult *= compare_" << typeName << "(" << srcName << "[" << elemNdx << "], ";
				generateValueSrc(src, entry, basePtr, elemNdx);
				src << ");\n";
			}
		}
		else
		{
			src << "\tresult *= compare_" << typeName << "(" << srcName << ", ";
			generateValueSrc(src, entry, basePtr, 0);
			src << ");\n";
		}
	}
	else if (type.isArrayType())
	{
		const VarType& elementType = type.getElementType();
		DE_ASSERT(!elementType.isArrayType());

		for (int elementNdx = 0; elementNdx < type.getArraySize(); elementNdx++)
		{
			std::string op = string("[") + de::toString(elementNdx) + "]";
			generateCompareSrc(src, resultVar, elementType, (string(srcName) + op).c_str(),
							   (string(apiName) + op).c_str(), layout, basePtr, unusedMask);
		}
	}
	else
	{
		DE_ASSERT(type.isStructType());

		for (StructType::ConstIterator memberIter = type.getStruct().begin(); memberIter != type.getStruct().end();
			 memberIter++)
		{
			if (memberIter->getFlags() & unusedMask)
				continue; // Skip member.

			string op = string(".") + memberIter->getName();
			generateCompareSrc(src, resultVar, memberIter->getType(), (string(srcName) + op).c_str(),
							   (string(apiName) + op).c_str(), layout, basePtr, unusedMask);
		}
	}
}